

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O0

void aom_highbd_filter_block1d4_h4_avx2
               (uint16_t *src_ptr,ptrdiff_t src_pitch,uint16_t *dst_ptr,ptrdiff_t dst_pitch,
               uint32_t height,int16_t *filter,int bd)

{
  undefined1 (*pauVar1) [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  uint uVar13;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar18 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar19 [64];
  int in_stack_00000008;
  __m256i res_1;
  __m256i r0;
  __m256i row0_1;
  __m256i row0_0;
  __m256i res;
  __m256i row1;
  __m256i row0;
  __m256i ip_mask_f4f5;
  __m256i ip_mask_f2f3;
  __m256i mask;
  __m256i zero;
  __m256i clip_pixel;
  uint32_t i;
  __m256i s [2];
  __m256i ff [2];
  __m256i rounding;
  undefined4 local_848;
  undefined8 local_840;
  undefined8 uStack_810;
  undefined1 local_820 [32];
  undefined8 uStack_808;
  __m256i *in_stack_fffffffffffff808;
  __m256i *in_stack_fffffffffffff810;
  undefined8 local_7c0;
  undefined8 *puStack_7a8;
  __m256i *palStack_790;
  uint local_6a4;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 uStack_610;
  undefined8 uStack_608;
  ulong uStack_5b8;
  undefined8 local_290;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  
  auVar18 = vpinsrd_avx(ZEXT416(0x40),0x40,1);
  auVar18 = vpinsrd_avx(auVar18,0x40,2);
  auVar18 = vpinsrd_avx(auVar18,0x40,3);
  auVar14 = vpinsrd_avx(ZEXT416(0x40),0x40,1);
  auVar14 = vpinsrd_avx(auVar14,0x40,2);
  auVar14 = vpinsrd_avx(auVar14,0x40,3);
  auVar14 = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar14;
  auVar18 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar18;
  if (in_stack_00000008 == 10) {
    local_848 = 0x3ff;
  }
  else {
    local_848 = 0xff;
    if (in_stack_00000008 == 0xc) {
      local_848 = 0xfff;
    }
  }
  auVar2 = vpinsrw_avx(ZEXT216((ushort)local_848),local_848,1);
  auVar2 = vpinsrw_avx(auVar2,local_848,2);
  auVar2 = vpinsrw_avx(auVar2,local_848,3);
  auVar2 = vpinsrw_avx(auVar2,local_848,4);
  auVar2 = vpinsrw_avx(auVar2,local_848,5);
  auVar2 = vpinsrw_avx(auVar2,local_848,6);
  auVar2 = vpinsrw_avx(auVar2,local_848,7);
  auVar15 = vpinsrw_avx(ZEXT216((ushort)local_848),local_848,1);
  auVar15 = vpinsrw_avx(auVar15,local_848,2);
  auVar15 = vpinsrw_avx(auVar15,local_848,3);
  auVar15 = vpinsrw_avx(auVar15,local_848,4);
  auVar15 = vpinsrw_avx(auVar15,local_848,5);
  auVar15 = vpinsrw_avx(auVar15,local_848,6);
  auVar15 = vpinsrw_avx(auVar15,local_848,7);
  uStack_1f0 = auVar15._0_8_;
  uStack_1e8 = auVar15._8_8_;
  uStack_5b8 = SUB328(ZEXT832(0),4);
  auVar19 = ZEXT1664(auVar15);
  pack_filters_4tap(local_820._8_8_,local_820._0_8_);
  local_6a4 = 0;
  while( true ) {
    palStack_790 = auVar19._0_8_;
    uStack_610 = auVar18._0_8_;
    uStack_608 = auVar18._8_8_;
    if (in_R8D - 2 < local_6a4) break;
    auVar15 = *(undefined1 (*) [16])(in_RDI + -2 + (ulong)(local_6a4 + 1) * in_RSI * 2);
    auVar16._0_16_ =
         ZEXT116(0) * auVar15 +
         ZEXT116(1) * *(undefined1 (*) [16])(in_RDI + -2 + (ulong)local_6a4 * in_RSI * 2);
    auVar16._16_16_ = ZEXT116(0) * auVar19._0_16_ + ZEXT116(1) * auVar15;
    auVar17 = vpshufd_avx2(auVar16,0x39);
    uStack_690 = auVar16._16_8_;
    uStack_688 = auVar16._24_8_;
    auVar12._16_8_ = uStack_690;
    auVar12._0_16_ = auVar16._0_16_;
    auVar12._24_8_ = uStack_688;
    auVar11[8] = '\x04';
    auVar11[9] = '\x05';
    auVar11[10] = '\x06';
    auVar11[0xb] = '\a';
    auVar11[0xc] = '\x06';
    auVar11[0xd] = '\a';
    auVar11[0xe] = '\b';
    auVar11[0xf] = '\t';
    auVar11[0] = '\0';
    auVar11[1] = '\x01';
    auVar11[2] = '\x02';
    auVar11[3] = '\x03';
    auVar11[4] = '\x02';
    auVar11[5] = '\x03';
    auVar11[6] = '\x04';
    auVar11[7] = '\x05';
    auVar11[0x10] = '\0';
    auVar11[0x11] = '\x01';
    auVar11[0x12] = '\x02';
    auVar11[0x13] = '\x03';
    auVar11[0x14] = '\x02';
    auVar11[0x15] = '\x03';
    auVar11[0x16] = '\x04';
    auVar11[0x17] = '\x05';
    auVar11[0x18] = '\x04';
    auVar11[0x19] = '\x05';
    auVar11[0x1a] = '\x06';
    auVar11[0x1b] = '\a';
    auVar11[0x1c] = '\x06';
    auVar11[0x1d] = '\a';
    auVar11[0x1e] = '\b';
    auVar11[0x1f] = '\t';
    vpshufb_avx2(auVar12,auVar11);
    auVar10[8] = '\x04';
    auVar10[9] = '\x05';
    auVar10[10] = '\x06';
    auVar10[0xb] = '\a';
    auVar10[0xc] = '\x06';
    auVar10[0xd] = '\a';
    auVar10[0xe] = '\b';
    auVar10[0xf] = '\t';
    auVar10[0] = '\0';
    auVar10[1] = '\x01';
    auVar10[2] = '\x02';
    auVar10[3] = '\x03';
    auVar10[4] = '\x02';
    auVar10[5] = '\x03';
    auVar10[6] = '\x04';
    auVar10[7] = '\x05';
    auVar10[0x10] = '\0';
    auVar10[0x11] = '\x01';
    auVar10[0x12] = '\x02';
    auVar10[0x13] = '\x03';
    auVar10[0x14] = '\x02';
    auVar10[0x15] = '\x03';
    auVar10[0x16] = '\x04';
    auVar10[0x17] = '\x05';
    auVar10[0x18] = '\x04';
    auVar10[0x19] = '\x05';
    auVar10[0x1a] = '\x06';
    auVar10[0x1b] = '\a';
    auVar10[0x1c] = '\x06';
    auVar10[0x1d] = '\a';
    auVar10[0x1e] = '\b';
    auVar10[0x1f] = '\t';
    auVar17 = vpshufb_avx2(auVar17,auVar10);
    convolve_4tap(in_stack_fffffffffffff810,in_stack_fffffffffffff808);
    auVar4._16_8_ = uStack_610;
    auVar4._0_16_ = auVar14;
    auVar4._24_8_ = uStack_608;
    auVar17 = vpaddd_avx2(auVar17,auVar4);
    auVar17 = vpsrad_avx2(auVar17,ZEXT416(7));
    auVar17 = vpackssdw_avx2(auVar17,auVar17);
    auVar6._16_8_ = uStack_1f0;
    auVar6._0_16_ = auVar2;
    auVar6._24_8_ = uStack_1e8;
    auVar17 = vpminsw_avx2(auVar17,auVar6);
    auVar19 = ZEXT864(uStack_5b8) << 0x40;
    auVar17 = vpmaxsw_avx2(auVar17,ZEXT832(uStack_5b8) << 0x40);
    local_7c0 = auVar17._0_8_;
    puStack_7a8 = auVar17._24_8_;
    *(undefined8 *)(in_RDX + (ulong)local_6a4 * in_RCX * 2) = local_7c0;
    *puStack_7a8 = local_290;
    local_6a4 = local_6a4 + 2;
  }
  if ((in_R8D & 1) != 0) {
    uVar13 = in_R8D - 1;
    pauVar1 = (undefined1 (*) [16])(in_RDI + 6 + (ulong)uVar13 * in_RSI * 2);
    auVar18 = *pauVar1;
    auVar15 = ZEXT116(0) * auVar18 +
              ZEXT116(1) * *(undefined1 (*) [16])(in_RDI + -2 + (ulong)uVar13 * in_RSI * 2);
    auVar18 = ZEXT116(0) * auVar19._0_16_ + ZEXT116(1) * auVar18;
    uStack_810 = auVar18._0_8_;
    uStack_808 = auVar18._8_8_;
    auVar9._16_8_ = uStack_810;
    auVar9._0_16_ = auVar15;
    auVar9._24_8_ = uStack_808;
    auVar8[8] = '\x04';
    auVar8[9] = '\x05';
    auVar8[10] = '\x06';
    auVar8[0xb] = '\a';
    auVar8[0xc] = '\x06';
    auVar8[0xd] = '\a';
    auVar8[0xe] = '\b';
    auVar8[0xf] = '\t';
    auVar8[0] = '\0';
    auVar8[1] = '\x01';
    auVar8[2] = '\x02';
    auVar8[3] = '\x03';
    auVar8[4] = '\x02';
    auVar8[5] = '\x03';
    auVar8[6] = '\x04';
    auVar8[7] = '\x05';
    auVar8[0x10] = '\0';
    auVar8[0x11] = '\x01';
    auVar8[0x12] = '\x02';
    auVar8[0x13] = '\x03';
    auVar8[0x14] = '\x02';
    auVar8[0x15] = '\x03';
    auVar8[0x16] = '\x04';
    auVar8[0x17] = '\x05';
    auVar8[0x18] = '\x04';
    auVar8[0x19] = '\x05';
    auVar8[0x1a] = '\x06';
    auVar8[0x1b] = '\a';
    auVar8[0x1c] = '\x06';
    auVar8[0x1d] = '\a';
    auVar8[0x1e] = '\b';
    auVar8[0x1f] = '\t';
    vpshufb_avx2(auVar9,auVar8);
    auVar7._16_8_ = uStack_810;
    auVar7._0_16_ = auVar15;
    auVar7._24_8_ = uStack_808;
    auVar17[8] = '\b';
    auVar17[9] = '\t';
    auVar17[10] = '\n';
    auVar17[0xb] = '\v';
    auVar17[0xc] = '\n';
    auVar17[0xd] = '\v';
    auVar17[0xe] = '\f';
    auVar17[0xf] = '\r';
    auVar17[0] = '\x04';
    auVar17[1] = '\x05';
    auVar17[2] = '\x06';
    auVar17[3] = '\a';
    auVar17[4] = '\x06';
    auVar17[5] = '\a';
    auVar17[6] = '\b';
    auVar17[7] = '\t';
    auVar17[0x10] = '\x04';
    auVar17[0x11] = '\x05';
    auVar17[0x12] = '\x06';
    auVar17[0x13] = '\a';
    auVar17[0x14] = '\x06';
    auVar17[0x15] = '\a';
    auVar17[0x16] = '\b';
    auVar17[0x17] = '\t';
    auVar17[0x18] = '\b';
    auVar17[0x19] = '\t';
    auVar17[0x1a] = '\n';
    auVar17[0x1b] = '\v';
    auVar17[0x1c] = '\n';
    auVar17[0x1d] = '\v';
    auVar17[0x1e] = '\f';
    auVar17[0x1f] = '\r';
    auVar17 = vpshufb_avx2(auVar7,auVar17);
    convolve_4tap(palStack_790,*(__m256i **)(*pauVar1 + 8));
    auVar3._16_8_ = uStack_610;
    auVar3._0_16_ = auVar14;
    auVar3._24_8_ = uStack_608;
    auVar17 = vpaddd_avx2(auVar17,auVar3);
    auVar17 = vpsrad_avx2(auVar17,ZEXT416(7));
    auVar17 = vpackssdw_avx2(auVar17,auVar17);
    auVar5._16_8_ = uStack_1f0;
    auVar5._0_16_ = auVar2;
    auVar5._24_8_ = uStack_1e8;
    auVar17 = vpminsw_avx2(auVar17,auVar5);
    auVar17 = vpmaxsw_avx2(auVar17,ZEXT832(uStack_5b8) << 0x40);
    local_840 = auVar17._0_8_;
    *(undefined8 *)(in_RDX + (ulong)uVar13 * in_RCX * 2) = local_840;
  }
  return;
}

Assistant:

static void aom_highbd_filter_block1d4_h4_avx2(
    const uint16_t *src_ptr, ptrdiff_t src_pitch, uint16_t *dst_ptr,
    ptrdiff_t dst_pitch, uint32_t height, const int16_t *filter, int bd) {
  const __m256i rounding = _mm256_set1_epi32(1 << (CONV8_ROUNDING_BITS - 1));
  __m256i ff[2], s[2];
  uint32_t i;
  const __m256i clip_pixel =
      _mm256_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m256i zero = _mm256_setzero_si256();

  static const uint8_t shuffle_mask[32] = { 0, 1, 2, 3, 2, 3, 4, 5, 4, 5, 6,
                                            7, 6, 7, 8, 9, 0, 1, 2, 3, 2, 3,
                                            4, 5, 4, 5, 6, 7, 6, 7, 8, 9 };

  __m256i mask = _mm256_loadu_si256((__m256i *)shuffle_mask);
  __m256i ip_mask_f2f3 = _mm256_loadu_si256((__m256i *)ip_shuffle_f2f3);
  __m256i ip_mask_f4f5 = _mm256_loadu_si256((__m256i *)ip_shuffle_f4f5);

  pack_filters_4tap(filter, ff);
  src_ptr -= 3;
  for (i = 0; i <= (height - 2); i += 2) {
    __m256i row0 = _mm256_castsi128_si256(
        _mm_loadu_si128((__m128i *)&src_ptr[i * src_pitch + 2]));
    __m256i row1 = _mm256_castsi128_si256(
        _mm_loadu_si128((__m128i *)&src_ptr[(i + 1) * src_pitch + 2]));

    s[0] = _mm256_inserti128_si256(row0, _mm256_castsi256_si128(row1), 1);
    s[1] = _mm256_alignr_epi8(s[0], s[0], 4);

    s[0] = _mm256_shuffle_epi8(s[0], mask);
    s[1] = _mm256_shuffle_epi8(s[1], mask);

    __m256i res = convolve_4tap(s, ff);
    res =
        _mm256_srai_epi32(_mm256_add_epi32(res, rounding), CONV8_ROUNDING_BITS);

    res = _mm256_packs_epi32(res, res);
    res = _mm256_min_epi16(res, clip_pixel);
    res = _mm256_max_epi16(res, zero);

    _mm_storel_epi64((__m128i *)&dst_ptr[i * dst_pitch],
                     _mm256_castsi256_si128(res));
    _mm_storel_epi64((__m128i *)&dst_ptr[(i + 1) * dst_pitch],
                     _mm256_extracti128_si256(res, 1));
  }
  if (height % 2 != 0) {
    i = height - 1;
    const __m256i row0_0 = _mm256_castsi128_si256(
        _mm_loadu_si128((__m128i *)&src_ptr[i * src_pitch + 2]));
    const __m256i row0_1 = _mm256_castsi128_si256(
        _mm_loadu_si128((__m128i *)&src_ptr[i * src_pitch + 6]));

    const __m256i r0 =
        _mm256_inserti128_si256(row0_0, _mm256_castsi256_si128(row0_1), 1);

    s[0] = _mm256_shuffle_epi8(r0, ip_mask_f2f3);
    s[1] = _mm256_shuffle_epi8(r0, ip_mask_f4f5);

    __m256i res = convolve_4tap(s, ff);
    res =
        _mm256_srai_epi32(_mm256_add_epi32(res, rounding), CONV8_ROUNDING_BITS);

    res = _mm256_packs_epi32(res, res);
    res = _mm256_min_epi16(res, clip_pixel);
    res = _mm256_max_epi16(res, zero);

    _mm_storel_epi64((__m128i *)&dst_ptr[i * dst_pitch],
                     _mm256_castsi256_si128(res));
  }
}